

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

Expression
dynet::detail::
f<dynet::Concatenate,std::vector<dynet::Expression,std::allocator<dynet::Expression>>,unsigned_int>
          (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *xs,uint *arg1)

{
  undefined4 uVar1;
  ComputationGraph *this;
  pointer pEVar2;
  VariableIndex VVar3;
  pointer pEVar4;
  Expression EVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_41;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  pEVar4 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this = pEVar4->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,
             (long)(xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4,&local_41);
  pEVar2 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar4 = (xs->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
    *local_40._M_impl.super__Vector_impl_data._M_start = pEVar4->i;
    local_40._M_impl.super__Vector_impl_data._M_start =
         local_40._M_impl.super__Vector_impl_data._M_start + 1;
  }
  VVar3 = ComputationGraph::
          add_function<dynet::Concatenate,std::vector<unsigned_int,std::allocator<unsigned_int>>,unsigned_int_const&>
                    (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,arg1);
  uVar1 = *(undefined4 *)(this + 0x38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  EVar5.graph_id = uVar1;
  EVar5.i = VVar3;
  EVar5.pg = this;
  return EVar5;
}

Assistant:

Expression f(const T& xs, const T1& arg1) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis, arg1));
}